

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O2

void __thiscall Transporter::Receive(Transporter *this,char *data,size_t len)

{
  ulong uVar1;
  byte bVar2;
  char *pcVar3;
  ulong uVar4;
  Transporter *this_00;
  ulong uVar5;
  size_t sVar6;
  string text;
  _Any_data local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  document;
  
  pcVar3 = this->buf;
  sVar6 = this->receiveSize;
  if (this->bufSize < sVar6 + len) {
    pcVar3 = (char *)realloc(pcVar3,this->bufSize + len);
    this->buf = pcVar3;
    sVar6 = this->receiveSize;
  }
  memcpy(pcVar3 + sVar6,data,len);
  sVar6 = len + this->receiveSize;
  this->receiveSize = sVar6;
  uVar4 = 0;
  uVar5 = uVar4;
LAB_0014be16:
  uVar1 = uVar5;
  if (uVar4 < sVar6) goto code_r0x0014be1b;
  goto LAB_0014be2e;
code_r0x0014be1b:
  uVar1 = uVar4 + 1;
  pcVar3 = data + uVar4;
  uVar4 = uVar1;
  if (*pcVar3 == '\n') {
LAB_0014be2e:
    uVar4 = uVar1;
    if (uVar5 == uVar4) {
      if (uVar5 != 0) {
        memcpy(this->buf,this->buf + uVar5,sVar6 - uVar5);
        this->receiveSize = this->receiveSize - uVar5;
      }
      return;
    }
    bVar2 = this->readHead;
    if ((bool)bVar2 == false) {
      text._M_dataplus._M_p = (pointer)&text.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&text,this->buf + uVar5,this->buf + uVar4);
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      local_68 = 0;
      uStack_60 = 0;
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::parse<std::__cxx11::string&>
                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&document,&text,(parser_callback_t *)&local_78,true,false);
      std::_Function_base::~_Function_base((_Function_base *)&local_78);
      this_00 = (Transporter *)&stack0xffffffffffffffb0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&stack0xffffffffffffffb0,&document);
      OnReceiveMessage(this_00,(json *)&stack0xffffffffffffffb0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&stack0xffffffffffffffb0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&document);
      std::__cxx11::string::~string((string *)&text);
      bVar2 = this->readHead;
      sVar6 = this->receiveSize;
    }
    this->readHead = (bool)(bVar2 ^ 1);
    uVar5 = uVar4;
  }
  goto LAB_0014be16;
}

Assistant:

void Transporter::Receive(const char* data, size_t len)
{
	if (bufSize < len + receiveSize)
	{
		// maybe a bug
		buf = static_cast<char*>(realloc(buf, bufSize + len));
	}
	memcpy(buf + receiveSize, data, len);
	receiveSize += len;

	size_t pos = 0;
	while (true)
	{
		size_t start = pos;
		for (size_t i = pos; i < receiveSize; i++)
		{
			if (data[i] == '\n')
			{
				pos = i + 1;
				break;
			}
		}
		if (start != pos)
		{
			if (readHead)
			{
				// skip
			}
			else
			{
				std::string text(buf + start, pos - start);
				auto document = nlohmann::json::parse(text);
				// bug 如果lua代码执行结束,这里行为未定义
				OnReceiveMessage(document);
			}
			readHead = !readHead;
		}
		else break;
	}

	if (pos > 0)
	{
		memcpy(buf, buf + pos, receiveSize - pos);
		receiveSize -= pos;
	}
}